

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O0

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int iVar1;
  boolean bVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  int in_R8D;
  char ch_1;
  long lval_1;
  char ch;
  long lval;
  char *scansarg;
  boolean simple_progressive;
  char *arg;
  int argn;
  char *in_stack_00000dd0;
  j_compress_ptr in_stack_00000dd8;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  char *in_stack_ffffffffffffffa8;
  char local_49;
  long local_48;
  long local_40;
  int local_34;
  char *local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  int local_c;
  long *local_8;
  
  local_40 = 0;
  local_34 = 0;
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  report = 0;
  strict = 0;
  copyoption = JCOPYOPT_COMMENTS;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = 0;
  transformoption.trim = 0;
  transformoption.force_grayscale = 0;
  transformoption.crop = 0;
  transformoption.slow_hflip = 0;
  *(undefined4 *)(*in_RDI + 0x7c) = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_24 = 1; local_24 < local_c; local_24 = local_24 + 1) {
    local_30 = *(char **)(local_18 + (long)local_24 * 8);
    if (*local_30 == '-') {
      local_30 = local_30 + 1;
      bVar2 = keymatch(in_stack_ffffffffffffffa8,
                       (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
      if (bVar2 == 0) {
        bVar2 = keymatch(in_stack_ffffffffffffffa8,
                         (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
        if (bVar2 == 0) {
          bVar2 = keymatch(in_stack_ffffffffffffffa8,
                           (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
          if (bVar2 == 0) {
            bVar2 = keymatch(in_stack_ffffffffffffffa8,
                             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff9c);
            if (bVar2 == 0) {
              bVar2 = keymatch(in_stack_ffffffffffffffa8,
                               (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                               ,in_stack_ffffffffffffff9c);
              if ((bVar2 == 0) &&
                 (bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                   (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                    in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c), bVar2 == 0)) {
                bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff9c);
                if (bVar2 != 0) {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  exit(0);
                }
                bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff9c);
                if (bVar2 == 0) {
                  bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                   (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                    in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c);
                  if ((bVar2 == 0) &&
                     (bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                       (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                        in_stack_ffffffffffffffa0),
                                       in_stack_ffffffffffffff9c), bVar2 == 0)) {
                    bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                     (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                      in_stack_ffffffffffffffa0),
                                     in_stack_ffffffffffffff9c);
                    if (bVar2 == 0) {
                      bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                       (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                        in_stack_ffffffffffffffa0),
                                       in_stack_ffffffffffffff9c);
                      if (bVar2 == 0) {
                        bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                         (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                          in_stack_ffffffffffffffa0),
                                         in_stack_ffffffffffffff9c);
                        if (bVar2 == 0) {
                          bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                           (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                            in_stack_ffffffffffffffa0),
                                           in_stack_ffffffffffffff9c);
                          if ((bVar2 == 0) &&
                             (bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                               (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                in_stack_ffffffffffffffa0),
                                               in_stack_ffffffffffffff9c), bVar2 == 0)) {
                            bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                             (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                              in_stack_ffffffffffffffa0),
                                             in_stack_ffffffffffffff9c);
                            if (bVar2 == 0) {
                              bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                               (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                in_stack_ffffffffffffffa0),
                                               in_stack_ffffffffffffff9c);
                              if (bVar2 == 0) {
                                bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                 (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                  in_stack_ffffffffffffffa0),
                                                 in_stack_ffffffffffffff9c);
                                if (bVar2 == 0) {
                                  bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                   (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                    in_stack_ffffffffffffffa0),
                                                   in_stack_ffffffffffffff9c);
                                  if (bVar2 == 0) {
                                    bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                     (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                      in_stack_ffffffffffffffa0),
                                                     in_stack_ffffffffffffff9c);
                                    if (bVar2 == 0) {
                                      bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                       (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                        in_stack_ffffffffffffffa0),
                                                       in_stack_ffffffffffffff9c);
                                      if (bVar2 == 0) {
                                        bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                         (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                          in_stack_ffffffffffffffa0)
                                                         ,in_stack_ffffffffffffff9c);
                                        if (bVar2 == 0) {
                                          bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                           (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                          if (bVar2 == 0) {
                                            bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                             (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                            if (bVar2 == 0) {
                                              bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                               (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                              if (bVar2 == 0) {
                                                bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                                 (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                                if (bVar2 == 0) {
                                                  bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                                   (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                                  if (bVar2 == 0) {
                                                    usage();
                                                  }
                                                  else {
                                                    local_24 = local_24 + 1;
                                                    if (local_c <= local_24) {
                                                      usage();
                                                    }
                                                    if ((transformoption.crop != 0) ||
                                                       (bVar2 = jtransform_parse_crop_spec
                                                                          ((jpeg_transform_info *)
                                                                           CONCAT44(
                                                  in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98),(char *)0x1036d9),
                                                  bVar2 == 0)) {
                                                    fprintf(_stderr,
                                                  "%s: bogus -wipe argument \'%s\'\n",progname,
                                                  *(undefined8 *)(local_18 + (long)local_24 * 8));
                                                  exit(1);
                                                  }
                                                  select_transform(JXFORM_NONE);
                                                  }
                                                }
                                                else {
                                                  transformoption.trim = 1;
                                                }
                                              }
                                              else {
                                                select_transform(JXFORM_NONE);
                                              }
                                            }
                                            else {
                                              select_transform(JXFORM_NONE);
                                            }
                                          }
                                          else {
                                            strict = 1;
                                          }
                                        }
                                        else {
                                          local_24 = local_24 + 1;
                                          if (local_c <= local_24) {
                                            usage();
                                          }
                                          local_40 = *(long *)(local_18 + (long)local_24 * 8);
                                        }
                                      }
                                      else {
                                        local_24 = local_24 + 1;
                                        if (local_c <= local_24) {
                                          usage();
                                        }
                                        bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                         (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                                          in_stack_ffffffffffffffa0)
                                                         ,in_stack_ffffffffffffff9c);
                                        if (bVar2 == 0) {
                                          bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                           (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                          if (bVar2 == 0) {
                                            bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                                             (char *)CONCAT17(
                                                  in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                                  in_stack_ffffffffffffff9c);
                                            if (bVar2 == 0) {
                                              usage();
                                            }
                                            else {
                                              select_transform(JXFORM_NONE);
                                            }
                                          }
                                          else {
                                            select_transform(JXFORM_NONE);
                                          }
                                        }
                                        else {
                                          select_transform(JXFORM_NONE);
                                        }
                                      }
                                    }
                                    else {
                                      in_stack_ffffffffffffffa7 = 'x';
                                      local_24 = local_24 + 1;
                                      if (local_c <= local_24) {
                                        usage();
                                      }
                                      iVar1 = __isoc99_sscanf(*(undefined8 *)
                                                               (local_18 + (long)local_24 * 8),
                                                              "%ld%c",&stack0xffffffffffffffa8,
                                                              &stack0xffffffffffffffa7);
                                      if (iVar1 < 1) {
                                        usage();
                                      }
                                      if (((long)in_stack_ffffffffffffffa8 < 0) ||
                                         (0xffff < (long)in_stack_ffffffffffffffa8)) {
                                        usage();
                                      }
                                      if ((in_stack_ffffffffffffffa7 == 'b') ||
                                         (in_stack_ffffffffffffffa7 == 'B')) {
                                        *(int *)(local_8 + 0x23) = (int)in_stack_ffffffffffffffa8;
                                        *(undefined4 *)((long)local_8 + 0x11c) = 0;
                                      }
                                      else {
                                        *(int *)((long)local_8 + 0x11c) =
                                             (int)in_stack_ffffffffffffffa8;
                                      }
                                    }
                                  }
                                  else {
                                    report = 1;
                                  }
                                }
                                else {
                                  local_34 = 1;
                                }
                              }
                              else {
                                transformoption.perfect = 1;
                              }
                            }
                            else {
                              local_24 = local_24 + 1;
                              if (local_c <= local_24) {
                                usage();
                              }
                              outfilename = *(char **)(local_18 + (long)local_24 * 8);
                            }
                          }
                          else {
                            *(undefined4 *)(local_8 + 0x21) = 1;
                          }
                        }
                        else {
                          local_24 = local_24 + 1;
                          if (local_c <= local_24) {
                            usage();
                          }
                          iVar1 = __isoc99_sscanf(*(undefined8 *)(local_18 + (long)local_24 * 8),
                                                  "%u",&max_scans);
                          if (iVar1 != 1) {
                            usage();
                          }
                        }
                      }
                      else {
                        local_49 = 'x';
                        local_24 = local_24 + 1;
                        if (local_c <= local_24) {
                          usage();
                        }
                        iVar1 = __isoc99_sscanf(*(undefined8 *)(local_18 + (long)local_24 * 8),
                                                "%ld%c",&local_48,&local_49);
                        if (iVar1 < 1) {
                          usage();
                        }
                        if ((local_49 == 'm') || (local_49 == 'M')) {
                          local_48 = local_48 * 1000;
                        }
                        *(long *)(local_8[1] + 0x58) = local_48 * 1000;
                      }
                    }
                    else {
                      local_24 = local_24 + 1;
                      if (local_c <= local_24) {
                        usage();
                      }
                      icc_filename = *(char **)(local_18 + (long)local_24 * 8);
                    }
                  }
                  else {
                    transformoption.force_grayscale = 1;
                  }
                }
                else {
                  local_24 = local_24 + 1;
                  if (local_c <= local_24) {
                    usage();
                  }
                  bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                   (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                    in_stack_ffffffffffffffa0),
                                   in_stack_ffffffffffffff9c);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                     (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                      in_stack_ffffffffffffffa0),
                                     in_stack_ffffffffffffff9c);
                    if (bVar2 == 0) {
                      usage();
                    }
                    else {
                      select_transform(JXFORM_NONE);
                    }
                  }
                  else {
                    select_transform(JXFORM_NONE);
                  }
                }
              }
              else {
                if (parse_switches::printed_version == 0) {
                  fprintf(_stderr,"%s version %s (build %s)\n","libjpeg-turbo","2.1.1","20250502");
                  fprintf(_stderr,"%s\n\n",
                          "Copyright (C) 2009-2021 D. R. Commander\nCopyright (C) 2015, 2020 Google, Inc.\nCopyright (C) 2019-2020 Arm Limited\nCopyright (C) 2015-2016, 2018 Matthieu Darbois\nCopyright (C) 2011-2016 Siarhei Siamashka\nCopyright (C) 2015 Intel Corporation\nCopyright (C) 2013-2014 Linaro Limited\nCopyright (C) 2013-2014 MIPS Technologies, Inc.\nCopyright (C) 2009, 2012 Pierre Ossman for Cendio AB\nCopyright (C) 2009-2011 Nokia Corporation and/or its subsidiary(-ies)\nCopyright (C) 1999-2006 MIYASAKA Masaru\nCopyright (C) 1991-2020 Thomas G. Lane, Guido Vollbeding"
                         );
                  fprintf(_stderr,"Emulating The Independent JPEG Group\'s software, version %s\n\n"
                          ,"6b  27-Mar-1998");
                  parse_switches::printed_version = 1;
                }
                *(int *)(*local_8 + 0x7c) = *(int *)(*local_8 + 0x7c) + 1;
              }
            }
            else {
              local_24 = local_24 + 1;
              if (local_c <= local_24) {
                usage();
              }
              if ((((transformoption.crop != 0) ||
                   (bVar2 = jtransform_parse_crop_spec
                                      ((jpeg_transform_info *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                                       ,(char *)0x102efc), bVar2 == 0)) ||
                  (transformoption.crop_width_set != JCROP_UNSET)) ||
                 (transformoption.crop_height_set != JCROP_UNSET)) {
                fprintf(_stderr,"%s: bogus -drop argument \'%s\'\n",progname,
                        *(undefined8 *)(local_18 + (long)local_24 * 8));
                exit(1);
              }
              local_24 = local_24 + 1;
              if (local_c <= local_24) {
                usage();
              }
              dropfilename = *(char **)(local_18 + (long)local_24 * 8);
              select_transform(JXFORM_NONE);
            }
          }
          else {
            local_24 = local_24 + 1;
            if (local_c <= local_24) {
              usage();
            }
            if ((transformoption.crop != 0) ||
               (bVar2 = jtransform_parse_crop_spec
                                  ((jpeg_transform_info *)
                                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                   (char *)0x102e63), bVar2 == 0)) {
              fprintf(_stderr,"%s: bogus -crop argument \'%s\'\n",progname,
                      *(undefined8 *)(local_18 + (long)local_24 * 8));
              exit(1);
            }
          }
        }
        else {
          local_24 = local_24 + 1;
          if (local_c <= local_24) {
            usage();
          }
          bVar2 = keymatch(in_stack_ffffffffffffffa8,
                           (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff9c);
          if (bVar2 == 0) {
            bVar2 = keymatch(in_stack_ffffffffffffffa8,
                             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff9c);
            if (bVar2 == 0) {
              bVar2 = keymatch(in_stack_ffffffffffffffa8,
                               (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0)
                               ,in_stack_ffffffffffffff9c);
              if (bVar2 == 0) {
                bVar2 = keymatch(in_stack_ffffffffffffffa8,
                                 (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                                  in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff9c);
                if (bVar2 == 0) {
                  usage();
                }
                else {
                  copyoption = JCOPYOPT_ALL;
                }
              }
              else {
                copyoption = JCOPYOPT_ICC;
              }
            }
            else {
              copyoption = JCOPYOPT_COMMENTS;
            }
          }
          else {
            copyoption = JCOPYOPT_NONE;
          }
        }
      }
      else {
        *(undefined4 *)((long)local_8 + 0x104) = 1;
      }
    }
    else {
      if (local_1c < local_24) break;
      outfilename = (char *)0x0;
    }
  }
  if (local_20 != 0) {
    if (local_34 != 0) {
      jpeg_simple_progression(local_8);
    }
    if ((local_40 != 0) &&
       (bVar2 = read_scan_script(in_stack_00000dd8,in_stack_00000dd0), bVar2 == 0)) {
      usage();
    }
  }
  return local_24;
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean simple_progressive;
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */
  simple_progressive = FALSE;
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  report = FALSE;
  strict = FALSE;
  copyoption = JCOPYOPT_DEFAULT;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = FALSE;
  transformoption.trim = FALSE;
  transformoption.force_grayscale = FALSE;
  transformoption.crop = FALSE;
  transformoption.slow_hflip = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "copy", 2)) {
      /* Select which extra markers to copy. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "none", 1)) {
        copyoption = JCOPYOPT_NONE;
      } else if (keymatch(argv[argn], "comments", 1)) {
        copyoption = JCOPYOPT_COMMENTS;
      } else if (keymatch(argv[argn], "icc", 1)) {
        copyoption = JCOPYOPT_ICC;
      } else if (keymatch(argv[argn], "all", 1)) {
        copyoption = JCOPYOPT_ALL;
      } else
        usage();

    } else if (keymatch(arg, "crop", 2)) {
      /* Perform lossless cropping. */
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -crop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "drop", 2)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn]) ||
          transformoption.crop_width_set != JCROP_UNSET ||
          transformoption.crop_height_set != JCROP_UNSET) {
        fprintf(stderr, "%s: bogus -drop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      if (++argn >= argc)       /* advance to next argument */
        usage();
      dropfilename = argv[argn];
      select_transform(JXFORM_DROP);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "flip", 1)) {
      /* Mirror left-right or top-bottom. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "horizontal", 1))
        select_transform(JXFORM_FLIP_H);
      else if (keymatch(argv[argn], "vertical", 1))
        select_transform(JXFORM_FLIP_V);
      else
        usage();

    } else if (keymatch(arg, "grayscale", 1) ||
               keymatch(arg, "greyscale", 1)) {
      /* Force to grayscale. */
#if TRANSFORMS_SUPPORTED
      transformoption.force_grayscale = TRUE;
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "perfect", 2)) {
      /* Fail if there is any partial edge MCUs that the transform can't
       * handle. */
      transformoption.perfect = TRUE;

    } else if (keymatch(arg, "progressive", 2)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "rotate", 2)) {
      /* Rotate 90, 180, or 270 degrees (measured clockwise). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "90", 2))
        select_transform(JXFORM_ROT_90);
      else if (keymatch(argv[argn], "180", 3))
        select_transform(JXFORM_ROT_180);
      else if (keymatch(argv[argn], "270", 3))
        select_transform(JXFORM_ROT_270);
      else
        usage();

    } else if (keymatch(arg, "scans", 1)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "transpose", 1)) {
      /* Transpose (across UL-to-LR axis). */
      select_transform(JXFORM_TRANSPOSE);

    } else if (keymatch(arg, "transverse", 6)) {
      /* Transverse transpose (across UR-to-LL axis). */
      select_transform(JXFORM_TRANSVERSE);

    } else if (keymatch(arg, "trim", 3)) {
      /* Trim off any partial edge MCUs that the transform can't handle. */
      transformoption.trim = TRUE;

    } else if (keymatch(arg, "wipe", 1)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -wipe argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      select_transform(JXFORM_WIPE);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}